

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenMemoryInitSetOffset(BinaryenExpressionRef expr,BinaryenExpressionRef offsetExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef offsetExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::MemoryInit>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<MemoryInit>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xda6,
                  "void BinaryenMemoryInitSetOffset(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (offsetExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)offsetExpr;
    return;
  }
  __assert_fail("offsetExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xda7,
                "void BinaryenMemoryInitSetOffset(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenMemoryInitSetOffset(BinaryenExpressionRef expr,
                                 BinaryenExpressionRef offsetExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryInit>());
  assert(offsetExpr);
  static_cast<MemoryInit*>(expression)->offset = (Expression*)offsetExpr;
}